

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

size_t jessilib::array_start_action<char16_t,jessilib::json_context<char16_t,true>>
                 (json_context<char16_t,_true> *inout_context,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> *inout_read_view)

{
  short sVar1;
  bool bVar2;
  size_t sVar3;
  invalid_argument *piVar4;
  char16_t *pcVar5;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *args_1;
  int iVar6;
  vector<jessilib::object,_std::allocator<jessilib::object>_> result;
  object obj;
  vector<jessilib::object,_std::allocator<jessilib::object>_> local_c8;
  string local_a8;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_88;
  undefined1 local_58;
  undefined8 local_40;
  char8_t *local_38;
  
  local_c8.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar3 = inout_read_view->_M_len;
  if (sVar3 != 0) {
    pcVar5 = inout_read_view->_M_str;
    do {
      sVar3 = sVar3 - 1;
      if ((0x20 < (ulong)(ushort)*pcVar5) ||
         ((0x100002600U >> ((ulong)(ushort)*pcVar5 & 0x3f) & 1) == 0)) break;
      inout_read_view->_M_str = pcVar5 + 1;
      inout_read_view->_M_len = sVar3;
      pcVar5 = pcVar5 + 1;
    } while (sVar3 != 0);
  }
  if (inout_read_view->_M_len == 0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,
               "Invalid JSON data: unexpected end of data when parsing object array; expected \']\'"
              );
  }
  else {
    if (*inout_read_view->_M_str == L']') {
      inout_read_view->_M_str = inout_read_view->_M_str + 1;
      inout_read_view->_M_len = inout_read_view->_M_len - 1;
      std::
      variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
      ::emplace<6ul,std::vector<jessilib::object,std::allocator<jessilib::object>>>
                ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                  *)inout_context->out_object,&local_c8);
LAB_0018b263:
      std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector(&local_c8);
      return 1;
    }
    do {
      local_88._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
      local_58 = 0;
      bVar2 = deserialize_json<char16_t,_true,_&jessilib::fail_action>
                        ((object *)&local_88._M_first,inout_read_view);
      iVar6 = 2;
      if (bVar2) {
        std::vector<jessilib::object,_std::allocator<jessilib::object>_>::
        emplace_back<jessilib::object>(&local_c8,(object *)&local_88._M_first);
        sVar3 = inout_read_view->_M_len;
        if (sVar3 != 0) {
          pcVar5 = inout_read_view->_M_str;
          do {
            sVar3 = sVar3 - 1;
            if ((0x20 < (ulong)(ushort)*pcVar5) ||
               ((0x100002600U >> ((ulong)(ushort)*pcVar5 & 0x3f) & 1) == 0)) break;
            inout_read_view->_M_str = pcVar5 + 1;
            inout_read_view->_M_len = sVar3;
            pcVar5 = pcVar5 + 1;
          } while (sVar3 != 0);
        }
        sVar3 = inout_read_view->_M_len;
        if (sVar3 != 0) {
          args_1 = (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)
                   inout_read_view->_M_str;
          sVar1 = (short)args_1->_M_len;
          if (sVar1 == 0x5d) {
            inout_read_view->_M_str = (char16_t *)((long)&args_1->_M_len + 2);
            inout_read_view->_M_len = sVar3 - 1;
            std::
            variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
            ::emplace<6ul,std::vector<jessilib::object,std::allocator<jessilib::object>>>
                      ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                        *)inout_context->out_object,&local_c8);
            iVar6 = 1;
          }
          else {
            if (sVar1 != 0x2c) {
              piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
              local_40 = 0x3d;
              local_38 = "Invalid JSON data: expected \',\' or \']\', instead encountered: ";
              join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char16_t,std::char_traits<char16_t>>&>
                        (&local_a8,(jessilib *)&local_40,
                         (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)inout_read_view,
                         args_1);
              std::invalid_argument::invalid_argument(piVar4,(string *)&local_a8);
              __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            inout_read_view->_M_str = (char16_t *)((long)&args_1->_M_len + 2);
            inout_read_view->_M_len = sVar3 - 1;
            iVar6 = 0;
            if (sVar3 - 1 != 0) {
              pcVar5 = (char16_t *)((long)&args_1->_M_len + 4);
              sVar3 = sVar3 - 2;
              do {
                iVar6 = 0;
                if ((0x20 < (ulong)(ushort)pcVar5[-1]) ||
                   (iVar6 = 0, (0x100002600U >> ((ulong)(ushort)pcVar5[-1] & 0x3f) & 1) == 0))
                break;
                inout_read_view->_M_str = pcVar5;
                inout_read_view->_M_len = sVar3;
                pcVar5 = pcVar5 + 1;
                bVar2 = sVar3 != 0;
                sVar3 = sVar3 - 1;
              } while (bVar2);
            }
          }
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                           *)&local_88._M_first);
      if (iVar6 != 0) {
        if (iVar6 != 2) goto LAB_0018b263;
        break;
      }
    } while (inout_read_view->_M_len != 0);
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,
               "Invalid JSON data: unexpected end of data when parsing object array; expected \']\'"
              );
  }
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t array_start_action(ContextT& inout_context, std::basic_string_view<CharT>& inout_read_view) {
	std::vector<object> result;

	advance_whitespace(inout_read_view);
	if (inout_read_view.empty()) {
		if constexpr (ContextT::use_exceptions) {
			throw std::invalid_argument{ "Invalid JSON data: unexpected end of data when parsing object array; expected ']'" };
		}

		return std::numeric_limits<size_t>::max();
	}

	// Checking here instead of top of loop means no trailing comma support.
	if (inout_read_view.front() == ']') {
		// End of array; success
		inout_read_view.remove_prefix(1);
		inout_context.out_object = std::move(result);
		return 1;
	}

	do {
		// Read object
		object obj;
		if (!deserialize_json<CharT, ContextT::use_exceptions>(obj, inout_read_view)) {
			// Invalid JSON! Any exception would've been thrown already
			break;
		}
		result.push_back(std::move(obj));

		advance_whitespace(inout_read_view);
		if (inout_read_view.empty()) {
			// Unexpected end of data; missing ']'; fail
			break;
		}

		CharT front = inout_read_view.front();
		if (front == ',') {
			// Strip comma
			inout_read_view.remove_prefix(1);
			advance_whitespace(inout_read_view);

			// Right now there's no trailing comma support; should behavior be a template option?
		}
		else if (front == ']') {
			// End of array; success
			inout_read_view.remove_prefix(1);
			inout_context.out_object = std::move(result);
			return 1;
		}
		else {
			// Invalid JSON!
			if constexpr (ContextT::use_exceptions) {
				using namespace std::literals;
				throw std::invalid_argument{ jessilib::join_mbstring(
					u8"Invalid JSON data: expected ',' or ']', instead encountered: "sv,
					inout_read_view) };
			}

			return std::numeric_limits<size_t>::max();
		}
	} while (!inout_read_view.empty());

	// Invalid JSON encountered
	if constexpr (ContextT::use_exceptions) {
		throw std::invalid_argument{ "Invalid JSON data: unexpected end of data when parsing object array; expected ']'" };
	}

	return std::numeric_limits<size_t>::max();
}